

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

void __thiscall
Imath_2_5::Box<Imath_2_5::Vec2<float>_>::extendBy
          (Box<Imath_2_5::Vec2<float>_> *this,Vec2<float> *point)

{
  float fVar1;
  float *pfVar2;
  Vec2<float> *in_RSI;
  Vec2<float> *in_RDI;
  
  pfVar2 = Vec2<float>::operator[](in_RSI,0);
  fVar1 = *pfVar2;
  pfVar2 = Vec2<float>::operator[](in_RDI,0);
  if (fVar1 < *pfVar2) {
    pfVar2 = Vec2<float>::operator[](in_RSI,0);
    fVar1 = *pfVar2;
    pfVar2 = Vec2<float>::operator[](in_RDI,0);
    *pfVar2 = fVar1;
  }
  pfVar2 = Vec2<float>::operator[](in_RSI,0);
  fVar1 = *pfVar2;
  pfVar2 = Vec2<float>::operator[](in_RDI + 1,0);
  if (*pfVar2 <= fVar1 && fVar1 != *pfVar2) {
    pfVar2 = Vec2<float>::operator[](in_RSI,0);
    fVar1 = *pfVar2;
    pfVar2 = Vec2<float>::operator[](in_RDI + 1,0);
    *pfVar2 = fVar1;
  }
  pfVar2 = Vec2<float>::operator[](in_RSI,1);
  fVar1 = *pfVar2;
  pfVar2 = Vec2<float>::operator[](in_RDI,1);
  if (fVar1 < *pfVar2) {
    pfVar2 = Vec2<float>::operator[](in_RSI,1);
    fVar1 = *pfVar2;
    pfVar2 = Vec2<float>::operator[](in_RDI,1);
    *pfVar2 = fVar1;
  }
  pfVar2 = Vec2<float>::operator[](in_RSI,1);
  fVar1 = *pfVar2;
  pfVar2 = Vec2<float>::operator[](in_RDI + 1,1);
  if (*pfVar2 <= fVar1 && fVar1 != *pfVar2) {
    pfVar2 = Vec2<float>::operator[](in_RSI,1);
    fVar1 = *pfVar2;
    pfVar2 = Vec2<float>::operator[](in_RDI + 1,1);
    *pfVar2 = fVar1;
  }
  return;
}

Assistant:

inline void
Box<Vec2<T> >::extendBy (const Vec2<T> &point)
{
    if (point[0] < min[0])
        min[0] = point[0];

    if (point[0] > max[0])
        max[0] = point[0];

    if (point[1] < min[1])
        min[1] = point[1];

    if (point[1] > max[1])
        max[1] = point[1];
}